

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

JSON * chaiscript::json::JSONParser::parse_next
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  const_reference pvVar1;
  runtime_error *this;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char local_21;
  size_t *psStack_20;
  char value;
  size_t *offset_local;
  string *str_local;
  
  psStack_20 = offset;
  offset_local = (size_t *)str;
  str_local = (string *)__return_storage_ptr__;
  consume_ws(str,offset);
  pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      offset_local,*psStack_20);
  local_21 = *pvVar1;
  if (local_21 == '\"') {
    parse_string(__return_storage_ptr__,(string *)offset_local,psStack_20);
  }
  else if (local_21 == '[') {
    parse_array(__return_storage_ptr__,(string *)offset_local,psStack_20);
  }
  else {
    if (local_21 != 'f') {
      if (local_21 == 'n') {
        parse_null(__return_storage_ptr__,(string *)offset_local,psStack_20);
        return __return_storage_ptr__;
      }
      if (local_21 != 't') {
        if (local_21 == '{') {
          parse_object(__return_storage_ptr__,(string *)offset_local,psStack_20);
          return __return_storage_ptr__;
        }
        if ((('9' < local_21) || (local_21 < '0')) && (local_21 != '-')) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,"JSON ERROR: Parse: Unexpected starting character \'",
                     &local_89);
          std::operator+(&local_68,&local_88,local_21);
          std::operator+(&local_48,&local_68,"\'");
          std::runtime_error::runtime_error(this,(string *)&local_48);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        parse_number(__return_storage_ptr__,(string *)offset_local,psStack_20);
        return __return_storage_ptr__;
      }
    }
    parse_bool(__return_storage_ptr__,(string *)offset_local,psStack_20);
  }
  return __return_storage_ptr__;
}

Assistant:

static JSON parse_next(const std::string &str, size_t &offset) {
      char value;
      consume_ws(str, offset);
      value = str.at(offset);
      switch (value) {
        case '[':
          return parse_array(str, offset);
        case '{':
          return parse_object(str, offset);
        case '\"':
          return parse_string(str, offset);
        case 't':
        case 'f':
          return parse_bool(str, offset);
        case 'n':
          return parse_null(str, offset);
        default:
          if ((value <= '9' && value >= '0') || value == '-') {
            return parse_number(str, offset);
          }
      }
      throw std::runtime_error(std::string("JSON ERROR: Parse: Unexpected starting character '") + value + "'");
    }